

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage.cc
# Opt level: O1

bool __thiscall tinyusdz::Stage::allocate_prim_id(Stage *this,uint64_t *prim_id)

{
  pointer puVar1;
  bool bVar2;
  uint64_t uVar3;
  
  if (prim_id == (uint64_t *)0x0) {
    return false;
  }
  puVar1 = (this->_prim_id_allocator).freeList_.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((this->_prim_id_allocator).freeList_.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start == puVar1) {
    uVar3 = (this->_prim_id_allocator).counter_;
    if (uVar3 + 1 < 2) {
      bVar2 = false;
      goto LAB_00339943;
    }
    (this->_prim_id_allocator).counter_ = uVar3 + 1;
  }
  else {
    uVar3 = puVar1[-1];
    (this->_prim_id_allocator).freeList_.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1 + -1;
    (this->_prim_id_allocator).dirty_ = true;
  }
  bVar2 = true;
LAB_00339943:
  if (bVar2 == false) {
    return false;
  }
  *prim_id = uVar3;
  return bVar2;
}

Assistant:

bool Stage::allocate_prim_id(uint64_t *prim_id) const {
  if (!prim_id) {
    return false;
  }

  uint64_t val;
  if (_prim_id_allocator.Allocate(&val)) {
    (*prim_id) = val;
    return true;
  }

  return false;
}